

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O0

TabularDataFile * __thiscall
asl::TabularDataFile::columns(TabularDataFile *this,Array<asl::String> *cols)

{
  Array<asl::String> AVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  EnumWrapper<const_asl::Array<asl::String>_> *pEVar6;
  TextFile *pTVar7;
  char *pcVar8;
  String *pSVar9;
  Array<asl::String> *e;
  Array<asl::String> *e_00;
  char local_22d;
  String local_198;
  undefined1 local_180 [8];
  String header;
  String local_160;
  String local_148;
  undefined1 local_130 [8];
  String type;
  undefined1 local_110 [7];
  char typec;
  undefined1 local_f8 [8];
  Array<asl::String> parts_1;
  String *col_1;
  EnumWrapper_ *local_d0;
  EnumWrapper_ *_b__1;
  String rel;
  int i2;
  int i1;
  String local_90;
  String local_68;
  undefined1 local_50 [8];
  Array<asl::String> parts;
  String *col;
  EnumWrapper_ *local_28;
  EnumWrapper_ *_b_;
  Array<asl::String> *cols_local;
  TabularDataFile *this_local;
  
  if (this->_separator == '\0') {
    this->_separator = ',';
  }
  _b_ = (EnumWrapper_ *)cols;
  cols_local = (Array<asl::String> *)this;
  iVar4 = Array<asl::String>::length(&this->_columnNames);
  if (iVar4 == 0) {
    TextFile::open(&this->_file,(char *)&this->_name,1);
    bVar2 = File::operator!((File *)this);
    if (bVar2) {
      return this;
    }
    newEnumerator<asl::Array<asl::String>>
              ((EnumWrapper<asl::Array<asl::String>_> *)&col,(asl *)_b_,e);
    local_28 = (EnumWrapper_ *)&col;
    while( true ) {
      pEVar6 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_28);
      bVar3 = EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar6);
      bVar2 = false;
      if (bVar3) {
        bVar2 = local_28->more != 0;
      }
      if (!bVar2) break;
      pEVar6 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_28);
      parts._a = Array<asl::String>::Enumerator::operator*((Enumerator *)(pEVar6 + 8));
      while (AVar1._a = parts._a, local_28->more != 0) {
        asl::String::String(&local_68,':');
        asl::String::split((String *)local_50,AVar1._a);
        asl::String::~String(&local_68);
        pSVar9 = Array<asl::String>::operator[]((Array<asl::String> *)local_50,0);
        Array<asl::String>::operator<<(&this->_columnNames,pSVar9);
        Array<asl::String>::~Array((Array<asl::String> *)local_50);
        local_28->more = 0;
      }
      pEVar6 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_28);
      Array<asl::String>::Enumerator::operator++((Enumerator *)(pEVar6 + 8));
      local_28->more = 1 - local_28->more;
    }
  }
  asl::String::toLowerCase(&local_90,&this->_name);
  bVar2 = asl::String::endsWith(&local_90,".arff");
  asl::String::~String(&local_90);
  if (bVar2) {
    this->_quote = '\'';
    asl::String::repeat((String *)&i2,this->_quote,2);
    asl::String::operator=(&this->_equote,(String *)&i2);
    asl::String::~String((String *)&i2);
    pSVar9 = &this->_name;
    iVar4 = asl::String::lastIndexOf(pSVar9,'/');
    iVar5 = asl::String::lastIndexOf(pSVar9,'\\');
    iVar4 = max<int>(iVar4 + 1,iVar5 + 1);
    rel.field_2._12_4_ = max<int>(iVar4,0);
    rel.field_2._8_4_ = asl::String::lastIndexOf(pSVar9,'.');
    asl::String::substring((String *)&_b__1,pSVar9,rel.field_2._12_4_,rel.field_2._8_4_);
    pTVar7 = TextFile::operator<<(&this->_file,"@relation ");
    pTVar7 = TextFile::operator<<(pTVar7,(String *)&_b__1);
    TextFile::operator<<(pTVar7,"\n\n");
    newEnumerator<asl::Array<asl::String>>
              ((EnumWrapper<asl::Array<asl::String>_> *)&col_1,(asl *)_b_,e_00);
    local_d0 = (EnumWrapper_ *)&col_1;
    while( true ) {
      pEVar6 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_d0);
      bVar3 = EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar6);
      bVar2 = false;
      if (bVar3) {
        bVar2 = local_d0->more != 0;
      }
      if (!bVar2) break;
      pEVar6 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_d0);
      parts_1._a = Array<asl::String>::Enumerator::operator*((Enumerator *)(pEVar6 + 8));
      while (AVar1._a = parts_1._a, local_d0->more != 0) {
        asl::String::String((String *)local_110,':');
        asl::String::split((String *)local_f8,AVar1._a);
        asl::String::~String((String *)local_110);
        iVar4 = Array<asl::String>::length((Array<asl::String> *)local_f8);
        if (iVar4 == 1) {
          local_22d = 'n';
        }
        else {
          pSVar9 = Array<asl::String>::operator[]((Array<asl::String> *)local_f8,1);
          pcVar8 = asl::String::operator[](pSVar9,0);
          local_22d = *pcVar8;
        }
        type.field_2._space[0xf] = local_22d;
        iVar4 = Array<asl::String>::length((Array<asl::String> *)local_f8);
        if (1 < iVar4) {
          pSVar9 = Array<asl::String>::operator[]((Array<asl::String> *)local_f8,1);
          iVar4 = asl::String::length(pSVar9);
          if (1 < iVar4) {
            pSVar9 = Array<asl::String>::operator[]((Array<asl::String> *)local_f8,1);
            bVar2 = asl::String::contains(pSVar9,'|');
            if (bVar2) {
              type.field_2._space[0xf] = 'c';
            }
          }
        }
        asl::String::String((String *)local_130);
        if (type.field_2._space[0xf] == 'c') {
          pSVar9 = Array<asl::String>::operator[]((Array<asl::String> *)local_f8,1);
          pSVar9 = asl::String::replaceme(pSVar9,'|',',');
          operator+(&local_160,'{',pSVar9);
          asl::String::operator+(&local_148,&local_160,'}');
          asl::String::operator=((String *)local_130,&local_148);
          asl::String::~String(&local_148);
          asl::String::~String(&local_160);
        }
        else if (type.field_2._space[0xf] == 'n') {
          asl::String::operator=((String *)local_130,"numeric");
        }
        else if (type.field_2._space[0xf] == 's') {
          asl::String::operator=((String *)local_130,"string");
        }
        pTVar7 = TextFile::operator<<(&this->_file,"@attribute ");
        pSVar9 = Array<asl::String>::operator[]((Array<asl::String> *)local_f8,0);
        pTVar7 = TextFile::operator<<(pTVar7,pSVar9);
        header.field_2._space[0xf] = ' ';
        pTVar7 = TextFile::operator<<(pTVar7,header.field_2._space + 0xf);
        pTVar7 = TextFile::operator<<(pTVar7,(String *)local_130);
        header.field_2._space[0xe] = '\n';
        TextFile::operator<<(pTVar7,header.field_2._space + 0xe);
        asl::String::~String((String *)local_130);
        Array<asl::String>::~Array((Array<asl::String> *)local_f8);
        local_d0->more = 0;
      }
      pEVar6 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_d0);
      Array<asl::String>::Enumerator::operator++((Enumerator *)(pEVar6 + 8));
      local_d0->more = 1 - local_d0->more;
    }
    TextFile::operator<<(&this->_file,"\n@data\n");
    asl::String::~String((String *)&_b__1);
  }
  else {
    asl::String::String(&local_198,this->_separator);
    Array<asl::String>::join((String *)local_180,&this->_columnNames,&local_198);
    asl::String::~String(&local_198);
    TextFile::operator<<(&this->_file,(String *)local_180);
    asl::String::~String((String *)local_180);
  }
  return this;
}

Assistant:

TabularDataFile& TabularDataFile::columns(const Array<String>& cols)
{
	if(_separator == '\0')
		_separator = ',';

	if(_columnNames.length() == 0)
	{
		_file.open(_name, File::WRITE);
		if(!_file)
		{
			return *this;
		}
		foreach(String& col, cols)
		{
			Array<String> parts = col.split(':');
			_columnNames << parts[0];
		}
	}
	if(_name.toLowerCase().endsWith(".arff"))
	{
		_quote = '\'';
		_equote = String::repeat(_quote, 2);
		int i1 = max(max(_name.lastIndexOf('/')+1, _name.lastIndexOf('\\')+1), 0);
		int i2 = _name.lastIndexOf('.');
		String rel = _name.substring(i1, i2);
		_file << "@relation " << rel << "\n\n";

		foreach(String& col, cols)
		{
			Array<String> parts = col.split(':');
			char typec = (parts.length()==1)? 'n' : parts[1][0];
			if(parts.length() > 1 && parts[1].length() > 1 && parts[1].contains('|'))
				typec = 'c';
			String type;
			switch(typec)
			{
			case 'n':
				type = "numeric";
				break;
			case 's':
				type = "string";
				break;
			case 'c':
				type = '{' + parts[1].replaceme('|', ',') + '}';
			}
			_file << "@attribute " << parts[0] << ' ' << type << '\n';
		}
		_file << "\n@data\n";
	}
	else
	{
		String header = _columnNames.join(_separator);
		_file << header;
	}
	return *this;
}